

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

void __thiscall
PathTracer::CmdRender(PathTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  uint32_t uint_push_constants [2];
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_f8;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_d8;
  __shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined8 local_b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  float local_ac;
  float local_a8;
  undefined1 local_98 [32];
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)local_98,
             &(((this->m_octree_ptr).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x10),
             &(((this->m_camera_ptr).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->m_descriptor_sets).
              super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &(((((this->m_lighting_ptr).super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_environment_map_ptr).
                super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &(this->m_sobol).m_descriptor_set.
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->m_target_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->m_noise_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 6;
  __l._M_array = (iterator)local_98;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)&local_f8,__l,(allocator_type *)uint_push_constants);
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::ComputePipeline,void>
            ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             &(this->m_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar1,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)&local_f8,(Ptr<PipelineBase> *)&local_b8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_f8);
  lVar4 = 0x58;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -8);
  uint_push_constants[0] = this->m_bounce;
  peVar2 = (this->m_lighting_ptr).super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uint_push_constants[1] = peVar2->m_light_type;
  peVar3 = (peVar2->m_environment_map_ptr).
           super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (uint_push_constants[1] == kEnvironmentMap) {
    uint_push_constants[1] =
         (uint32_t)
         ((peVar3->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         != (element_type *)0x0);
  }
  local_b8._0_4_ = (peVar2->m_sun_radiance).field_0;
  local_b8._4_4_ = (peVar2->m_sun_radiance).field_1;
  local_b0 = (peVar2->m_sun_radiance).field_2;
  local_ac = peVar3->m_rotation;
  local_a8 = peVar3->m_multiplier;
  local_c0 = &(this->m_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x20,0,8,uint_push_constants);
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x20,8,0x14,&local_b8);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::ComputePipeline,void>
            ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)local_98,local_c0);
  myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  myvk::CommandBuffer::CmdDispatch
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,((this->m_width >> 3) + 1) - (uint)((this->m_width & 7) == 0),
             ((this->m_height >> 3) + 1) - (uint)((this->m_height & 7) == 0),1);
  local_98._16_8_ = (pointer)0x0;
  local_98._0_8_ = (element_type *)0x0;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,0x800,0x800,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)local_98,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_f8,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d8);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_f8);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
            ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)local_98);
  Sobol::CmdNext(&this->m_sobol,command_buffer);
  return;
}

Assistant:

void PathTracer::CmdRender(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) {
	command_buffer->CmdBindDescriptorSets({m_octree_ptr->GetDescriptorSet(),
	                                       m_camera_ptr->GetFrameDescriptorSet(kFrameCount),
	                                       m_lighting_ptr->GetEnvironmentMapPtr()->GetDescriptorSet(),
	                                       m_sobol.GetDescriptorSet(), m_target_descriptor_set, m_noise_descriptor_set},
	                                      m_pipeline);

	uint32_t uint_push_constants[] = {m_bounce, (uint32_t)m_lighting_ptr->GetFinalLightType()};
	float float_push_constants[] = {
	    m_lighting_ptr->m_sun_radiance.x, m_lighting_ptr->m_sun_radiance.y, m_lighting_ptr->m_sun_radiance.z,
	    m_lighting_ptr->GetEnvironmentMapPtr()->m_rotation, m_lighting_ptr->GetEnvironmentMapPtr()->m_multiplier};

	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, 0, sizeof(uint_push_constants),
	                                 uint_push_constants);
	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, sizeof(uint_push_constants),
	                                 sizeof(float_push_constants), float_push_constants);
	command_buffer->CmdBindPipeline(m_pipeline);
	command_buffer->CmdDispatch(group_8(m_width), group_8(m_height), 1);

	command_buffer->CmdPipelineBarrier(VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
	                                   {}, {});

	m_sobol.CmdNext(command_buffer);
}